

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O2

fsg_arciter_t * fsg_model_arcs(fsg_model_t *fsg,int32 i)

{
  fsg_arciter_t *pfVar1;
  hash_iter_t *phVar2;
  trans_list_t *ptVar3;
  
  if ((fsg->trans[i].trans == (hash_table_t *)0x0) &&
     (fsg->trans[i].null_trans == (hash_table_t *)0x0)) {
    pfVar1 = (fsg_arciter_t *)0x0;
  }
  else {
    pfVar1 = (fsg_arciter_t *)
             __ckd_calloc__(1,0x18,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                            ,0x122);
    ptVar3 = fsg->trans;
    if (ptVar3[i].null_trans != (hash_table_t *)0x0) {
      phVar2 = hash_table_iter(ptVar3[i].null_trans);
      pfVar1->null_itor = phVar2;
      ptVar3 = fsg->trans;
    }
    if (ptVar3[i].trans == (hash_table_t *)0x0) {
      phVar2 = pfVar1->itor;
    }
    else {
      phVar2 = hash_table_iter(ptVar3[i].trans);
      pfVar1->itor = phVar2;
    }
    if (phVar2 != (hash_iter_t *)0x0) {
      pfVar1->gn = (gnode_t *)phVar2->ent->val;
    }
  }
  return pfVar1;
}

Assistant:

fsg_arciter_t *
fsg_model_arcs(fsg_model_t * fsg, int32 i)
{
    fsg_arciter_t *itor;

    if (fsg->trans[i].trans == NULL && fsg->trans[i].null_trans == NULL)
        return NULL;
    itor = ckd_calloc(1, sizeof(*itor));
    if (fsg->trans[i].null_trans)
        itor->null_itor = hash_table_iter(fsg->trans[i].null_trans);
    if (fsg->trans[i].trans)
        itor->itor = hash_table_iter(fsg->trans[i].trans);
    if (itor->itor != NULL)
        itor->gn = hash_entry_val(itor->itor->ent);
    return itor;
}